

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void split_bezier(bezier_t *b,bezier_t *first,bezier_t *second)

{
  float fVar1;
  float c;
  bezier_t *second_local;
  bezier_t *first_local;
  bezier_t *b_local;
  
  fVar1 = (b->x2 + b->x3) * 0.5;
  first->x2 = (b->x1 + b->x2) * 0.5;
  second->x3 = (b->x3 + b->x4) * 0.5;
  first->x1 = b->x1;
  second->x4 = b->x4;
  first->x3 = (first->x2 + fVar1) * 0.5;
  second->x2 = (second->x3 + fVar1) * 0.5;
  fVar1 = (first->x3 + second->x2) * 0.5;
  second->x1 = fVar1;
  first->x4 = fVar1;
  fVar1 = (b->y2 + b->y3) * 0.5;
  first->y2 = (b->y1 + b->y2) * 0.5;
  second->y3 = (b->y3 + b->y4) * 0.5;
  first->y1 = b->y1;
  second->y4 = b->y4;
  first->y3 = (first->y2 + fVar1) * 0.5;
  second->y2 = (second->y3 + fVar1) * 0.5;
  fVar1 = (first->y3 + second->y2) * 0.5;
  second->y1 = fVar1;
  first->y4 = fVar1;
  return;
}

Assistant:

static inline void split_bezier(const bezier_t* b, bezier_t* first, bezier_t* second)
{
    float c = (b->x2 + b->x3) * 0.5f;
    first->x2 = (b->x1 + b->x2) * 0.5f;
    second->x3 = (b->x3 + b->x4) * 0.5f;
    first->x1 = b->x1;
    second->x4 = b->x4;
    first->x3 = (first->x2 + c) * 0.5f;
    second->x2 = (second->x3 + c) * 0.5f;
    first->x4 = second->x1 = (first->x3 + second->x2) * 0.5f;

    c = (b->y2 + b->y3) * 0.5f;
    first->y2 = (b->y1 + b->y2) * 0.5f;
    second->y3 = (b->y3 + b->y4) * 0.5f;
    first->y1 = b->y1;
    second->y4 = b->y4;
    first->y3 = (first->y2 + c) * 0.5f;
    second->y2 = (second->y3 + c) * 0.5f;
    first->y4 = second->y1 = (first->y3 + second->y2) * 0.5f;
}